

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

char * __thiscall
MemoryLeakDetector::allocMemory
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,size_t size,char *file,
          size_t line,bool allocatNodesSeperately)

{
  uchar uVar1;
  MemLeakPeriod MVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MemoryLeakDetectorNode *pMVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar4;
  
  uVar7 = size + 3 & 0xfffffffffffffff8;
  iVar3 = (*allocator->_vptr_TestMemoryAllocator[2])
                    (allocator,uVar7 + (ulong)!allocatNodesSeperately * 0x40 + 8,file,line);
  pcVar4 = (char *)CONCAT44(extraout_var,iVar3);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    if (allocatNodesSeperately) {
      iVar3 = (*allocator->_vptr_TestMemoryAllocator[8])(allocator,0x40);
      pMVar5 = (MemoryLeakDetectorNode *)CONCAT44(extraout_var_00,iVar3);
    }
    else {
      pMVar5 = (MemoryLeakDetectorNode *)(pcVar4 + uVar7 + 8);
    }
    uVar6 = this->allocationSequenceNumber_;
    this->allocationSequenceNumber_ = uVar6 + 1;
    MVar2 = this->current_period_;
    uVar1 = this->current_allocation_stage_;
    pMVar5->number_ = uVar6;
    pMVar5->memory_ = pcVar4;
    pMVar5->size_ = size;
    pMVar5->allocator_ = allocator;
    pMVar5->period_ = MVar2;
    pMVar5->allocation_stage_ = uVar1;
    pMVar5->file_ = file;
    pMVar5->line_ = line;
    pcVar4[size + 2] = 'S';
    (pcVar4 + size)[0] = 'B';
    (pcVar4 + size)[1] = 'A';
    pcVar4 = pMVar5->memory_;
    uVar6 = (int)pcVar4 + (int)((ulong)pcVar4 / 0x49) * -0x49;
    pMVar5->next_ = (this->memoryTable_).table_[uVar6].head_;
    (this->memoryTable_).table_[uVar6].head_ = pMVar5;
  }
  return pcVar4;
}

Assistant:

char* MemoryLeakDetector::allocMemory(TestMemoryAllocator* allocator, size_t size, const char* file, size_t line, bool allocatNodesSeperately)
{
#ifdef CPPUTEST_DISABLE_MEM_CORRUPTION_CHECK
   allocatNodesSeperately = true;
#endif
    /* With malloc, it is harder to guarantee that the allocator free is called.
     * This is because operator new is overloaded via linker symbols, but malloc just via #defines.
     * If the same allocation is used and the wrong free is called, it will deallocate the memory leak information
     * without the memory leak detector ever noticing it!
     * So, for malloc, we'll allocate the memory separately so we can detect this and give a proper error.
     */

    char* memory = allocateMemoryWithAccountingInformation(allocator, size, file, line, allocatNodesSeperately);
    if (memory == NULLPTR) return NULLPTR;
    MemoryLeakDetectorNode* node = createMemoryLeakAccountingInformation(allocator, size, memory, allocatNodesSeperately);

    storeLeakInformation(node, memory, size, allocator, file, line);
    return node->memory_;
}